

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall
delta_complex_t::if_common_create_all
          (delta_complex_t *this,size_t start,size_t end,int dim,char *filter,size_t thread,
          vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
          *new_cells,
          vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
          *new_cliques,
          vector<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>,_std::allocator<std::vector<std::tuple<long,_long,_long>,_std::allocator<std::tuple<long,_long,_long>_>_>_>_>
          *new_clique_cofaces,
          vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
          *new_cell_cofaces)

{
  long lVar1;
  _Rb_tree_node_base *p_Var2;
  ulong cl;
  
  cl = (ulong)(int)start;
  if (cl < end) {
    do {
      lVar1 = *(long *)&(((this->cells).
                          super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                        )._M_impl +
              **(long **)(*(long *)&(this->cliques).
                                    super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(long)dim + -1].
                                    super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                                    super__Vector_impl_data + 0x18 + cl * 0x70) * 0xe8;
      for (p_Var2 = *(_Rb_tree_node_base **)(lVar1 + 0x98);
          p_Var2 != (_Rb_tree_node_base *)(lVar1 + 0x88);
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        if_common_create(this,cl,*(index_t *)(p_Var2 + 1),(long)dim,filter,thread,new_cells,
                         new_cliques,new_clique_cofaces,new_cell_cofaces);
      }
      cl = cl + 1;
    } while (cl < end);
  }
  return;
}

Assistant:

void if_common_create_all(size_t start, size_t end, int dim, const char* filter, size_t thread,
         std::vector<std::vector<delta_complex_cell_t>>& new_cells, std::vector<std::vector<clique_t>>& new_cliques,
        std::vector<std::vector<std::tuple<index_t, index_t, index_t>>>& new_clique_cofaces,std::vector<std::vector<std::pair<index_t, index_t>>>& new_cell_cofaces){
        for(int c = start; c < end; c++){
            for(auto v : cells[0][cliques[dim-1][c].vertices[0]].neighbours){
                if_common_create(c,v,dim,filter,thread,new_cells,new_cliques,new_clique_cofaces,new_cell_cofaces);
            }
        }
    }